

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,ProgramNode *node)

{
  Context *this_00;
  _List_node_base *p_Var1;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar2;
  RuntimeFunctionAnalyser functionAnalyser;
  NumberValueAnalyser valueAnalyser;
  RuntimeFunctionAnalyser RStack_88;
  undefined **local_48;
  undefined1 local_40;
  double local_38;
  char local_30;
  
  p_Var1 = (_List_node_base *)&node->variables_;
  while (p_Var1 = (((_List_base<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&node->variables_) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x10))(p_Var1[1]._M_next,this);
  }
  p_Var1 = (_List_node_base *)&node->functions_;
  while (p_Var1 = (((_List_base<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&node->functions_) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x10))(p_Var1[1]._M_next,this);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&RStack_88,"main",(allocator<char> *)&local_48);
  this_00 = &this->context_;
  oVar2 = Context::lookup(this_00,(string *)&RStack_88,0);
  std::__cxx11::string::~string((string *)&RStack_88);
  RuntimeFunctionAnalyser::RuntimeFunctionAnalyser(&RStack_88);
  if (((undefined1  [16])
       oVar2.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> & (undefined1  [16])0x1)
      != (undefined1  [16])0x0) {
    (**(code **)(*(long *)oVar2.
                          super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
                          _M_payload.
                          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
                          _M_payload + 0x10))
              (oVar2.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
               _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
               _M_payload,&RStack_88);
    Context::enterScope(this_00);
    (*((RStack_88.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_StatementNode).super_Node._vptr_Node[2])
              (RStack_88.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this
              );
    Context::leaveScope(this_00);
    local_48 = &PTR__ValueVisitor_001d1278;
    local_40 = 0;
    local_30 = '\0';
    (*((this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
       super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
       super__Head_base<0UL,_Value_*,_false>._M_head_impl)->_vptr_Value[3])();
    if (local_30 != '\0') {
      this->exitCode_ = (int)local_38;
      RuntimeFunctionAnalyser::~RuntimeFunctionAnalyser(&RStack_88);
      return;
    }
    std::__throw_bad_optional_access();
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::visit(const ProgramNode& node)
{
  for(const auto& variable : node.getVariables())
    variable->accept(*this);

  for(const auto& function : node.getFunctions())
    function->accept(*this);

  const auto mainSymbol = context_.lookup("main");
  auto functionAnalyser = RuntimeFunctionAnalyser{};
  mainSymbol.value().get().accept(functionAnalyser);

  context_.enterScope();
  functionAnalyser.getBody()->accept(*this);
  context_.leaveScope();

  auto valueAnalyser = NumberValueAnalyser{};
  value_->accept(valueAnalyser);
  exitCode_ = valueAnalyser.getValue().value();
}